

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O3

void __thiscall Diligent::PipelineStateVkImpl::~PipelineStateVkImpl(PipelineStateVkImpl *this)

{
  ~PipelineStateVkImpl(this);
  free(this);
  return;
}

Assistant:

PipelineStateVkImpl::~PipelineStateVkImpl()
{
    // Make sure that asynchrous task is complete as it references the pipeline object.
    // This needs to be done in the final class before the destruction begins.
    GetStatus(/*WaitForCompletion =*/true);

    Destruct();
}